

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_base32.cpp
# Opt level: O1

bool ON_Base32ToString(uchar *base32_digits,int base32_digit_count,char *sBase32)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  char cVar4;
  
  if (sBase32 == (char *)0x0) {
    bVar1 = false;
  }
  else {
    if (base32_digit_count < 1 || base32_digits == (uchar *)0x0) {
      *sBase32 = '#';
      pcVar3 = sBase32 + 1;
      bVar1 = false;
    }
    else {
      bVar1 = true;
      lVar2 = 0;
      do {
        if ((ulong)base32_digits[lVar2] < 0x20) {
          cVar4 = "0123456789ABCDEFGHJKMNPQRTUVWXYZ"[base32_digits[lVar2]];
        }
        else {
          bVar1 = false;
          cVar4 = '#';
        }
        sBase32[lVar2] = cVar4;
        lVar2 = lVar2 + 1;
      } while (base32_digit_count != (int)lVar2);
      pcVar3 = sBase32 + lVar2;
    }
    *pcVar3 = '\0';
  }
  return bVar1;
}

Assistant:

bool ON_Base32ToString( const unsigned char* base32_digits, int base32_digit_count, char* sBase32 )
{
  const char* base32_digit_symbol = "0123456789ABCDEFGHJKMNPQRTUVWXYZ";
  const char error_symbol = '#';
  unsigned char d;
  bool rc = false;

  if ( 0 == sBase32 )
    return false;

  if ( 0 == base32_digits || base32_digit_count <= 0 )
  {
    *sBase32++ = error_symbol;
  }
  else
  {
    rc = true;
    while(base32_digit_count--)
    {
      d = *base32_digits++;
      if ( d < 32 )
      {
        *sBase32++ = base32_digit_symbol[d];
      }
      else
      {
        rc = false;
        *sBase32++ = error_symbol;
      }
    }
  }
  *sBase32 = 0; // nullptr terminate string

  return rc;
}